

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O1

err_t cmdStampGen(char *stamp_name,char *name)

{
  bool_t bVar1;
  err_t eVar2;
  octet *stamp;
  
  bVar1 = strIsValid(name);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = strIsValid(stamp_name);
    if (bVar1 != 0) {
      stamp = (octet *)blobCreate(10);
      if (stamp == (octet *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        cmdFileStamp(stamp,name,0);
        bVar1 = cmdFileAreSame(name,stamp_name);
        if (bVar1 == 0) {
          eVar2 = cmdFileWrite(stamp_name,stamp,10);
        }
        else {
          eVar2 = cmdFileAppend(name,stamp,10);
        }
        blobClose(stamp);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t cmdStampGen(const char* stamp_name, const char* name)
{
	err_t code;
	octet* stamp;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(stamp_name))
		return ERR_BAD_INPUT;
	// сгенерировать штамп
	code = cmdBlobCreate(stamp, 10);
	ERR_CALL_CHECK(code);
	cmdFileStamp(stamp, name, FALSE);
	// сохранить штамп
	if (cmdFileAreSame(name, stamp_name))
		code = cmdFileAppend(name, stamp, 10);
	else
		code = cmdFileWrite(stamp_name, stamp, 10);
	// завершить
	cmdBlobClose(stamp);
	return code;
}